

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O0

string * nivalis::latex_to_nivalis(string *expr_in)

{
  initializer_list<char> __l;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_00;
  initializer_list<char> __l_01;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_02;
  initializer_list<char> __l_03;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_04;
  initializer_list<char> __l_05;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_06;
  initializer_list<char> __l_07;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_08;
  initializer_list<char> __l_09;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_10;
  initializer_list<char> __l_11;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_12;
  initializer_list<char> __l_13;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_14;
  string_view to;
  string_view to_00;
  string_view to_01;
  string_view to_02;
  string_view to_03;
  string_view to_04;
  string_view to_05;
  string_view to_06;
  string_view to_07;
  string_view to_08;
  string_view to_09;
  string_view to_10;
  string_view to_11;
  string_view to_12;
  string_view to_13;
  string_view src;
  string_view src_00;
  string_view src_01;
  string_view src_02;
  string_view src_03;
  string_view src_04;
  string_view src_05;
  string_view src_06;
  string_view src_07;
  string_view src_08;
  string_view src_09;
  string_view src_10;
  string_view src_11;
  string_view src_12;
  string_view src_13;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  undefined1 *puVar6;
  ulong uVar7;
  size_type sVar8;
  long lVar9;
  long lVar10;
  string *in_RSI;
  string *in_RDI;
  long *in_FS_OFFSET;
  reference rVar11;
  size_t i_3;
  string tmp_2;
  size_t i_2;
  anon_class_1_0_00000001 is_opchar;
  size_t sub_level;
  vector<bool,_std::allocator<bool>_> brace_subs;
  char last_nonspace;
  string tmp_1;
  size_t i_1;
  string tmp;
  size_t len;
  size_t i;
  string expr;
  undefined4 in_stack_ffffffffffffe758;
  undefined1 in_stack_ffffffffffffe75c;
  undefined1 in_stack_ffffffffffffe75d;
  undefined1 in_stack_ffffffffffffe75e;
  char in_stack_ffffffffffffe75f;
  ParenRuleOutputItem *in_stack_ffffffffffffe760;
  allocator<char> *in_stack_ffffffffffffe768;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffe770;
  char __c;
  size_type in_stack_ffffffffffffe778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe780;
  allocator_type *in_stack_ffffffffffffe788;
  ParenRuleOutputItem *in_stack_ffffffffffffe790;
  flag_type __f;
  char *in_stack_ffffffffffffe798;
  string *psVar12;
  undefined4 in_stack_ffffffffffffe7a0;
  match_flag_type in_stack_ffffffffffffe7a4;
  char *in_stack_ffffffffffffe7a8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffe7b0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *__e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe7b8;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffe7c0;
  string *in_stack_ffffffffffffe838;
  size_t in_stack_ffffffffffffe840;
  char *in_stack_ffffffffffffe848;
  string *in_stack_ffffffffffffe850;
  ParenRule *in_stack_ffffffffffffe858;
  bool local_1741;
  undefined8 ****local_1378;
  undefined8 ****local_1348;
  undefined8 ****local_1318;
  undefined8 ****local_12e8;
  undefined8 ****local_12b8;
  undefined8 ****local_1288;
  undefined8 ****local_1258;
  undefined8 ****local_1228;
  ulong local_11f8;
  string local_11f0 [64];
  string local_11b0 [32];
  reference local_1190;
  reference local_1180;
  string local_1170 [32];
  string local_1150 [39];
  byte local_1129;
  string local_1128 [32];
  ulong local_1108;
  long local_10f8;
  char local_10c2;
  allocator<char> local_10c1;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_10c0;
  string local_10a0 [32];
  string local_1080 [32];
  string local_1060 [32];
  string local_1040 [32];
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [64];
  string local_f80 [64];
  string local_f40 [32];
  ulong local_f20;
  allocator<char> local_f11;
  string local_f10 [32];
  char *local_ef0;
  ulong local_ee8;
  string local_ec0 [64];
  string local_e80 [55];
  allocator<char> local_e49;
  string local_e48 [32];
  undefined1 local_e28 [16];
  string local_e18 [55];
  allocator<char> local_de1;
  string local_de0 [32];
  undefined1 local_dc0 [16];
  string local_db0 [55];
  allocator<char> local_d79;
  string local_d78 [32];
  undefined1 local_d58 [16];
  string local_d48 [55];
  allocator<char> local_d11;
  string local_d10 [32];
  undefined1 local_cf0 [16];
  string local_ce0 [55];
  allocator<char> local_ca9;
  string local_ca8 [32];
  undefined1 local_c88 [16];
  string local_c78 [55];
  allocator<char> local_c41;
  string local_c40 [32];
  undefined1 local_c20 [16];
  string local_c10 [55];
  allocator<char> local_bd9;
  string local_bd8 [32];
  undefined1 local_bb8 [16];
  string local_ba8 [55];
  allocator<char> local_b71;
  string local_b70 [32];
  undefined1 local_b50 [16];
  string local_b40 [55];
  allocator<char> local_b09;
  string local_b08 [32];
  undefined1 local_ae8 [16];
  string local_ad8 [55];
  allocator<char> local_aa1;
  string local_aa0 [32];
  undefined1 local_a80 [16];
  string local_a70 [55];
  allocator<char> local_a39;
  string local_a38 [32];
  undefined1 local_a18 [16];
  string local_a08 [55];
  allocator<char> local_9d1;
  string local_9d0 [32];
  undefined1 local_9b0 [16];
  string local_9a0 [55];
  allocator<char> local_969;
  string local_968 [32];
  undefined1 local_948 [16];
  string local_938 [55];
  allocator<char> local_901;
  string local_900 [32];
  undefined1 local_8e0 [16];
  string local_8d0 [55];
  allocator<char> local_899;
  string local_898 [32];
  undefined1 local_878 [16];
  string local_868 [32];
  string local_848 [39];
  byte local_821;
  string local_820 [32];
  undefined4 local_800;
  allocator<char> local_7f9;
  string local_7f8 [37];
  undefined1 local_7d3;
  undefined1 local_7d2;
  undefined1 ****local_7d0;
  undefined8 ***local_7c8 [5];
  undefined1 local_7a0 [40];
  undefined1 local_778 [40];
  undefined1 local_750 [40];
  undefined1 local_728 [40];
  undefined1 ****local_700;
  undefined8 local_6f8;
  allocator<char> local_6eb;
  undefined1 local_6ea;
  undefined1 local_6e9;
  undefined1 *local_6e8;
  undefined8 local_6e0;
  allocator<char> local_6d4;
  undefined1 local_6d3;
  undefined1 local_6d2;
  undefined1 ****local_6d0;
  undefined8 ***local_6c8 [5];
  undefined1 local_6a0 [40];
  undefined1 local_678 [40];
  undefined1 local_650 [40];
  undefined1 local_628 [40];
  undefined1 ****local_600;
  undefined8 local_5f8;
  allocator<char> local_5eb;
  undefined1 local_5ea;
  undefined1 local_5e9;
  undefined1 *local_5e8;
  undefined8 local_5e0;
  allocator<char> local_5d4;
  undefined1 local_5d3;
  undefined1 local_5d2;
  undefined1 ****local_5d0;
  undefined8 ***local_5c8 [5];
  undefined1 local_5a0 [40];
  undefined1 local_578 [40];
  undefined1 local_550 [40];
  undefined1 local_528 [40];
  undefined1 ****local_500;
  undefined8 local_4f8;
  allocator<char> local_4eb;
  undefined1 local_4ea;
  undefined1 local_4e9;
  undefined1 *local_4e8;
  undefined8 local_4e0;
  allocator<char> local_4d4;
  undefined1 local_4d3;
  undefined1 local_4d2;
  undefined1 ****local_4d0;
  undefined8 ***local_4c8 [5];
  undefined1 local_4a0 [40];
  undefined1 local_478 [40];
  undefined1 local_450 [40];
  undefined1 local_428 [40];
  undefined1 ****local_400;
  undefined8 local_3f8;
  allocator<char> local_3eb;
  undefined1 local_3ea;
  undefined1 local_3e9;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  allocator<char> local_3d4;
  undefined1 local_3d3;
  undefined1 local_3d2;
  undefined1 ****local_3d0;
  undefined8 ***local_3c8 [5];
  undefined1 local_3a0 [40];
  undefined1 local_378 [40];
  undefined1 local_350 [40];
  undefined1 local_328 [40];
  undefined1 ****local_300;
  undefined8 local_2f8;
  allocator<char> local_2eb;
  undefined1 local_2ea;
  undefined1 local_2e9;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  allocator<char> local_2d4;
  undefined1 local_2d3;
  undefined1 local_2d2;
  undefined1 ****local_2d0;
  undefined8 ***local_2c8 [5];
  undefined1 local_2a0 [40];
  undefined1 local_278 [40];
  undefined1 local_250 [40];
  undefined1 local_228 [40];
  undefined1 ****local_200;
  undefined8 local_1f8;
  allocator<char> local_1eb;
  undefined1 local_1ea;
  undefined1 local_1e9;
  undefined1 *local_1e8;
  undefined8 local_1e0;
  allocator<char> local_1d4;
  undefined1 local_1d3;
  undefined1 local_1d2;
  undefined1 ****local_1d0;
  undefined8 ***local_1c8 [5];
  undefined1 local_1a0 [40];
  undefined1 local_178 [40];
  undefined1 ****local_150;
  undefined8 local_148;
  allocator<char> local_13a;
  undefined1 local_139;
  undefined1 *local_138;
  undefined8 local_130;
  allocator<char> local_124;
  undefined1 local_123;
  undefined1 local_122;
  undefined1 ****local_120;
  undefined8 ***local_118 [5];
  undefined1 local_f0 [40];
  undefined1 local_c8 [40];
  undefined1 local_a0 [40];
  undefined1 local_78 [40];
  undefined1 ****local_50;
  undefined8 local_48;
  allocator<char> local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 *local_38;
  undefined8 local_30;
  allocator<char> local_11;
  string *local_10;
  
  local_10 = in_RSI;
  if ((char)in_FS_OFFSET[-0x84] == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
               in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
    local_123 = 1;
    local_3a = 0x5b;
    local_39 = 0x7b;
    local_38 = &local_3a;
    local_30 = 2;
    std::allocator<char>::allocator();
    __l._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l._M_array = in_stack_ffffffffffffe798;
    __l._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe790,__l,
               (allocator_type *)in_stack_ffffffffffffe788);
    local_122 = 1;
    local_120 = (undefined1 ****)local_118;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_120 = (undefined1 ****)local_f0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_120 = (undefined1 ****)local_c8;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_120 = (undefined1 ****)local_a0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_120 = (undefined1 ****)local_78;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_50 = (undefined1 ****)local_118;
    local_48 = 5;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x279e95
              );
    __l_00._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_00._M_array = (iterator)in_stack_ffffffffffffe798;
    __l_00._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)in_stack_ffffffffffffe790,__l_00,in_stack_ffffffffffffe788);
    local_122 = 0;
    local_123 = 0;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::~allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x279ee1
              );
    local_1228 = &local_50;
    do {
      local_1228 = local_1228 + -5;
      anon_unknown_1::ParenRule::ParenRuleOutputItem::~ParenRuleOutputItem
                ((ParenRuleOutputItem *)0x279f18);
    } while (local_1228 != local_118);
    std::allocator<char>::~allocator(&local_3b);
    std::allocator<char>::~allocator(&local_11);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x470,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x84) = 1;
  }
  if ((char)in_FS_OFFSET[-0x79] == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
               in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
    local_1d3 = 1;
    local_139 = 0x7b;
    local_138 = &local_139;
    local_130 = 1;
    std::allocator<char>::allocator();
    __l_01._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_01._M_array = in_stack_ffffffffffffe798;
    __l_01._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe790,__l_01,
               (allocator_type *)in_stack_ffffffffffffe788);
    local_1d2 = 1;
    local_1d0 = (undefined1 ****)local_1c8;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_1d0 = (undefined1 ****)local_1a0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_1d0 = (undefined1 ****)local_178;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_150 = (undefined1 ****)local_1c8;
    local_148 = 3;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27a0c4
              );
    __l_02._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_02._M_array = (iterator)in_stack_ffffffffffffe798;
    __l_02._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)in_stack_ffffffffffffe790,__l_02,in_stack_ffffffffffffe788);
    local_1d2 = 0;
    local_1d3 = 0;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::~allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27a110
              );
    local_1258 = &local_150;
    do {
      local_1258 = local_1258 + -5;
      anon_unknown_1::ParenRule::ParenRuleOutputItem::~ParenRuleOutputItem
                ((ParenRuleOutputItem *)0x27a145);
    } while (local_1258 != local_1c8);
    std::allocator<char>::~allocator(&local_13a);
    std::allocator<char>::~allocator(&local_124);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x418,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x79) = 1;
  }
  if ((char)in_FS_OFFSET[-0x6e] == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
               in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
    local_2d3 = 1;
    local_1ea = 0x7b;
    local_1e9 = 0x7b;
    local_1e8 = &local_1ea;
    local_1e0 = 2;
    std::allocator<char>::allocator();
    __l_03._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_03._M_array = in_stack_ffffffffffffe798;
    __l_03._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe790,__l_03,
               (allocator_type *)in_stack_ffffffffffffe788);
    local_2d2 = 1;
    local_2d0 = (undefined1 ****)local_2c8;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_2d0 = (undefined1 ****)local_2a0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_2d0 = (undefined1 ****)local_278;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_2d0 = (undefined1 ****)local_250;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_2d0 = (undefined1 ****)local_228;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_200 = (undefined1 ****)local_2c8;
    local_1f8 = 5;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27a333
              );
    __l_04._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_04._M_array = (iterator)in_stack_ffffffffffffe798;
    __l_04._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)in_stack_ffffffffffffe790,__l_04,in_stack_ffffffffffffe788);
    local_2d2 = 0;
    local_2d3 = 0;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::~allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27a37f
              );
    local_1288 = &local_200;
    do {
      local_1288 = local_1288 + -5;
      anon_unknown_1::ParenRule::ParenRuleOutputItem::~ParenRuleOutputItem
                ((ParenRuleOutputItem *)0x27a3b6);
    } while (local_1288 != local_2c8);
    std::allocator<char>::~allocator(&local_1eb);
    std::allocator<char>::~allocator(&local_1d4);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x3c0,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x6e) = 1;
  }
  if ((char)in_FS_OFFSET[-99] == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
               in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
    local_3d3 = 1;
    local_2ea = 0x7b;
    local_2e9 = 0x28;
    local_2e8 = &local_2ea;
    local_2e0 = 2;
    std::allocator<char>::allocator();
    __l_05._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_05._M_array = in_stack_ffffffffffffe798;
    __l_05._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe790,__l_05,
               (allocator_type *)in_stack_ffffffffffffe788);
    local_3d2 = 1;
    local_3d0 = (undefined1 ****)local_3c8;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_3d0 = (undefined1 ****)local_3a0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_3d0 = (undefined1 ****)local_378;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_3d0 = (undefined1 ****)local_350;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_3d0 = (undefined1 ****)local_328;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_300 = (undefined1 ****)local_3c8;
    local_2f8 = 5;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27a5a4
              );
    __l_06._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_06._M_array = (iterator)in_stack_ffffffffffffe798;
    __l_06._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)in_stack_ffffffffffffe790,__l_06,in_stack_ffffffffffffe788);
    local_3d2 = 0;
    local_3d3 = 0;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::~allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27a5f0
              );
    local_12b8 = &local_300;
    do {
      local_12b8 = local_12b8 + -5;
      anon_unknown_1::ParenRule::ParenRuleOutputItem::~ParenRuleOutputItem
                ((ParenRuleOutputItem *)0x27a627);
    } while (local_12b8 != local_3c8);
    std::allocator<char>::~allocator(&local_2eb);
    std::allocator<char>::~allocator(&local_2d4);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x368,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -99) = 1;
  }
  if ((char)in_FS_OFFSET[-0x58] == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
               in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
    local_4d3 = 1;
    local_3ea = 0x7b;
    local_3e9 = 0x5e;
    local_3e8 = &local_3ea;
    local_3e0 = 2;
    std::allocator<char>::allocator();
    __l_07._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_07._M_array = in_stack_ffffffffffffe798;
    __l_07._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe790,__l_07,
               (allocator_type *)in_stack_ffffffffffffe788);
    local_4d2 = 1;
    local_4d0 = (undefined1 ****)local_4c8;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_4d0 = (undefined1 ****)local_4a0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_4d0 = (undefined1 ****)local_478;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_4d0 = (undefined1 ****)local_450;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_4d0 = (undefined1 ****)local_428;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_400 = (undefined1 ****)local_4c8;
    local_3f8 = 5;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27a815
              );
    __l_08._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_08._M_array = (iterator)in_stack_ffffffffffffe798;
    __l_08._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)in_stack_ffffffffffffe790,__l_08,in_stack_ffffffffffffe788);
    local_4d2 = 0;
    local_4d3 = 0;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::~allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27a861
              );
    local_12e8 = &local_400;
    do {
      local_12e8 = local_12e8 + -5;
      anon_unknown_1::ParenRule::ParenRuleOutputItem::~ParenRuleOutputItem
                ((ParenRuleOutputItem *)0x27a898);
    } while (local_12e8 != local_4c8);
    std::allocator<char>::~allocator(&local_3eb);
    std::allocator<char>::~allocator(&local_3d4);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x310,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x58) = 1;
  }
  if ((char)in_FS_OFFSET[-0x4d] == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
               in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
    local_5d3 = 1;
    local_4ea = 0x7b;
    local_4e9 = 0x5e;
    local_4e8 = &local_4ea;
    local_4e0 = 2;
    std::allocator<char>::allocator();
    __l_09._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_09._M_array = in_stack_ffffffffffffe798;
    __l_09._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe790,__l_09,
               (allocator_type *)in_stack_ffffffffffffe788);
    local_5d2 = 1;
    local_5d0 = (undefined1 ****)local_5c8;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_5d0 = (undefined1 ****)local_5a0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_5d0 = (undefined1 ****)local_578;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_5d0 = (undefined1 ****)local_550;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_5d0 = (undefined1 ****)local_528;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_500 = (undefined1 ****)local_5c8;
    local_4f8 = 5;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27aa86
              );
    __l_10._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_10._M_array = (iterator)in_stack_ffffffffffffe798;
    __l_10._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)in_stack_ffffffffffffe790,__l_10,in_stack_ffffffffffffe788);
    local_5d2 = 0;
    local_5d3 = 0;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::~allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27aad2
              );
    local_1318 = &local_500;
    do {
      local_1318 = local_1318 + -5;
      anon_unknown_1::ParenRule::ParenRuleOutputItem::~ParenRuleOutputItem
                ((ParenRuleOutputItem *)0x27ab09);
    } while (local_1318 != local_5c8);
    std::allocator<char>::~allocator(&local_4eb);
    std::allocator<char>::~allocator(&local_4d4);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x2b8,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x4d) = 1;
  }
  if ((char)in_FS_OFFSET[-0x42] == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
               in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
    local_6d3 = 1;
    local_5ea = 0x7b;
    local_5e9 = 0x5e;
    local_5e8 = &local_5ea;
    local_5e0 = 2;
    std::allocator<char>::allocator();
    __l_11._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_11._M_array = in_stack_ffffffffffffe798;
    __l_11._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe790,__l_11,
               (allocator_type *)in_stack_ffffffffffffe788);
    local_6d2 = 1;
    local_6d0 = (undefined1 ****)local_6c8;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_6d0 = (undefined1 ****)local_6a0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_6d0 = (undefined1 ****)local_678;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_6d0 = (undefined1 ****)local_650;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_6d0 = (undefined1 ****)local_628;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_600 = (undefined1 ****)local_6c8;
    local_5f8 = 5;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27acf7
              );
    __l_12._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_12._M_array = (iterator)in_stack_ffffffffffffe798;
    __l_12._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)in_stack_ffffffffffffe790,__l_12,in_stack_ffffffffffffe788);
    local_6d2 = 0;
    local_6d3 = 0;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::~allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27ad43
              );
    local_1348 = &local_600;
    do {
      local_1348 = local_1348 + -5;
      anon_unknown_1::ParenRule::ParenRuleOutputItem::~ParenRuleOutputItem
                ((ParenRuleOutputItem *)0x27ad7a);
    } while (local_1348 != local_6c8);
    std::allocator<char>::~allocator(&local_5eb);
    std::allocator<char>::~allocator(&local_5d4);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x260,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x42) = 1;
  }
  if ((char)in_FS_OFFSET[-0x37] == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
               in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
    local_7d3 = 1;
    local_6ea = 0x7b;
    local_6e9 = 0x7b;
    local_6e8 = &local_6ea;
    local_6e0 = 2;
    std::allocator<char>::allocator();
    __l_13._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_13._M_array = in_stack_ffffffffffffe798;
    __l_13._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe790,__l_13,
               (allocator_type *)in_stack_ffffffffffffe788);
    local_7d2 = 1;
    local_7d0 = (undefined1 ****)local_7c8;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_7d0 = (undefined1 ****)local_7a0;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_7d0 = (undefined1 ****)local_778;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_7d0 = (undefined1 ****)local_750;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe760,
               CONCAT13(in_stack_ffffffffffffe75f,
                        CONCAT12(in_stack_ffffffffffffe75e,
                                 CONCAT11(in_stack_ffffffffffffe75d,in_stack_ffffffffffffe75c))));
    local_7d0 = (undefined1 ****)local_728;
    anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem
              (in_stack_ffffffffffffe790,(char *)in_stack_ffffffffffffe788);
    local_700 = (undefined1 ****)local_7c8;
    local_6f8 = 5;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27af68
              );
    __l_14._M_len._0_4_ = in_stack_ffffffffffffe7a0;
    __l_14._M_array = (iterator)in_stack_ffffffffffffe798;
    __l_14._M_len._4_4_ = in_stack_ffffffffffffe7a4;
    std::
    vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
    ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
              *)in_stack_ffffffffffffe790,__l_14,in_stack_ffffffffffffe788);
    local_7d2 = 0;
    local_7d3 = 0;
    std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>::~allocator
              ((allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> *)0x27afb4
              );
    local_1378 = &local_700;
    do {
      local_1378 = local_1378 + -5;
      anon_unknown_1::ParenRule::ParenRuleOutputItem::~ParenRuleOutputItem
                ((ParenRuleOutputItem *)0x27afeb);
    } while (local_1378 != local_7c8);
    std::allocator<char>::~allocator(&local_6eb);
    std::allocator<char>::~allocator(&local_6d4);
    __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x208,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x37) = 1;
  }
  std::__cxx11::string::string(local_7f8,local_10);
  util::trim((string *)0x27b078);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    uVar4 = std::__cxx11::string::size();
    local_821 = 0;
    bVar2 = false;
    if (5 < uVar4) {
      std::__cxx11::string::substr((ulong)local_820,(ulong)local_7f8);
      local_821 = 1;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffe760,
                              (char *)CONCAT17(in_stack_ffffffffffffe75f,
                                               CONCAT16(in_stack_ffffffffffffe75e,
                                                        CONCAT15(in_stack_ffffffffffffe75d,
                                                                 CONCAT14(in_stack_ffffffffffffe75c,
                                                                          in_stack_ffffffffffffe758)
                                                                ))));
      bVar2 = false;
      if (bVar1) {
        pcVar5 = (char *)std::__cxx11::string::back();
        bVar2 = *pcVar5 == '}';
      }
    }
    if ((local_821 & 1) != 0) {
      std::__cxx11::string::~string(local_820);
    }
    if (bVar2) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_848,(ulong)local_7f8);
      std::operator+((char *)in_stack_ffffffffffffe768,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe760);
      std::__cxx11::string::~string(local_848);
    }
    else {
      local_878 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src._M_str = (char *)in_stack_ffffffffffffe858;
      src._M_len = (size_t)in_stack_ffffffffffffe850;
      to._M_str = in_stack_ffffffffffffe848;
      to._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src,in_stack_ffffffffffffe838,to);
      std::__cxx11::string::operator=(local_7f8,local_868);
      std::__cxx11::string::~string(local_868);
      std::__cxx11::string::~string(local_898);
      std::allocator<char>::~allocator(&local_899);
      local_8e0 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_00._M_str = (char *)in_stack_ffffffffffffe858;
      src_00._M_len = (size_t)in_stack_ffffffffffffe850;
      to_00._M_str = in_stack_ffffffffffffe848;
      to_00._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_00,in_stack_ffffffffffffe838,to_00);
      std::__cxx11::string::operator=(local_7f8,local_8d0);
      std::__cxx11::string::~string(local_8d0);
      std::__cxx11::string::~string(local_900);
      std::allocator<char>::~allocator(&local_901);
      local_948 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_01._M_str = (char *)in_stack_ffffffffffffe858;
      src_01._M_len = (size_t)in_stack_ffffffffffffe850;
      to_01._M_str = in_stack_ffffffffffffe848;
      to_01._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_01,in_stack_ffffffffffffe838,to_01);
      std::__cxx11::string::operator=(local_7f8,local_938);
      std::__cxx11::string::~string(local_938);
      std::__cxx11::string::~string(local_968);
      std::allocator<char>::~allocator(&local_969);
      local_9b0 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_02._M_str = (char *)in_stack_ffffffffffffe858;
      src_02._M_len = (size_t)in_stack_ffffffffffffe850;
      to_02._M_str = in_stack_ffffffffffffe848;
      to_02._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_02,in_stack_ffffffffffffe838,to_02);
      std::__cxx11::string::operator=(local_7f8,local_9a0);
      std::__cxx11::string::~string(local_9a0);
      std::__cxx11::string::~string(local_9d0);
      std::allocator<char>::~allocator(&local_9d1);
      local_a18 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_03._M_str = (char *)in_stack_ffffffffffffe858;
      src_03._M_len = (size_t)in_stack_ffffffffffffe850;
      to_03._M_str = in_stack_ffffffffffffe848;
      to_03._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_03,in_stack_ffffffffffffe838,to_03);
      std::__cxx11::string::operator=(local_7f8,local_a08);
      std::__cxx11::string::~string(local_a08);
      std::__cxx11::string::~string(local_a38);
      std::allocator<char>::~allocator(&local_a39);
      local_a80 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_04._M_str = (char *)in_stack_ffffffffffffe858;
      src_04._M_len = (size_t)in_stack_ffffffffffffe850;
      to_04._M_str = in_stack_ffffffffffffe848;
      to_04._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_04,in_stack_ffffffffffffe838,to_04);
      std::__cxx11::string::operator=(local_7f8,local_a70);
      std::__cxx11::string::~string(local_a70);
      std::__cxx11::string::~string(local_aa0);
      std::allocator<char>::~allocator(&local_aa1);
      local_ae8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_05._M_str = (char *)in_stack_ffffffffffffe858;
      src_05._M_len = (size_t)in_stack_ffffffffffffe850;
      to_05._M_str = in_stack_ffffffffffffe848;
      to_05._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_05,in_stack_ffffffffffffe838,to_05);
      std::__cxx11::string::operator=(local_7f8,local_ad8);
      std::__cxx11::string::~string(local_ad8);
      std::__cxx11::string::~string(local_b08);
      std::allocator<char>::~allocator(&local_b09);
      local_b50 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_06._M_str = (char *)in_stack_ffffffffffffe858;
      src_06._M_len = (size_t)in_stack_ffffffffffffe850;
      to_06._M_str = in_stack_ffffffffffffe848;
      to_06._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_06,in_stack_ffffffffffffe838,to_06);
      std::__cxx11::string::operator=(local_7f8,local_b40);
      std::__cxx11::string::~string(local_b40);
      std::__cxx11::string::~string(local_b70);
      std::allocator<char>::~allocator(&local_b71);
      local_bb8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_07._M_str = (char *)in_stack_ffffffffffffe858;
      src_07._M_len = (size_t)in_stack_ffffffffffffe850;
      to_07._M_str = in_stack_ffffffffffffe848;
      to_07._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_07,in_stack_ffffffffffffe838,to_07);
      std::__cxx11::string::operator=(local_7f8,local_ba8);
      std::__cxx11::string::~string(local_ba8);
      std::__cxx11::string::~string(local_bd8);
      std::allocator<char>::~allocator(&local_bd9);
      local_c20 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_08._M_str = (char *)in_stack_ffffffffffffe858;
      src_08._M_len = (size_t)in_stack_ffffffffffffe850;
      to_08._M_str = in_stack_ffffffffffffe848;
      to_08._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_08,in_stack_ffffffffffffe838,to_08);
      std::__cxx11::string::operator=(local_7f8,local_c10);
      std::__cxx11::string::~string(local_c10);
      std::__cxx11::string::~string(local_c40);
      std::allocator<char>::~allocator(&local_c41);
      local_c88 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_09._M_str = (char *)in_stack_ffffffffffffe858;
      src_09._M_len = (size_t)in_stack_ffffffffffffe850;
      to_09._M_str = in_stack_ffffffffffffe848;
      to_09._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_09,in_stack_ffffffffffffe838,to_09);
      std::__cxx11::string::operator=(local_7f8,local_c78);
      std::__cxx11::string::~string(local_c78);
      std::__cxx11::string::~string(local_ca8);
      std::allocator<char>::~allocator(&local_ca9);
      local_cf0 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_10._M_str = (char *)in_stack_ffffffffffffe858;
      src_10._M_len = (size_t)in_stack_ffffffffffffe850;
      to_10._M_str = in_stack_ffffffffffffe848;
      to_10._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_10,in_stack_ffffffffffffe838,to_10);
      std::__cxx11::string::operator=(local_7f8,local_ce0);
      std::__cxx11::string::~string(local_ce0);
      std::__cxx11::string::~string(local_d10);
      std::allocator<char>::~allocator(&local_d11);
      local_d58 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_11._M_str = (char *)in_stack_ffffffffffffe858;
      src_11._M_len = (size_t)in_stack_ffffffffffffe850;
      to_11._M_str = in_stack_ffffffffffffe848;
      to_11._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_11,in_stack_ffffffffffffe838,to_11);
      std::__cxx11::string::operator=(local_7f8,local_d48);
      std::__cxx11::string::~string(local_d48);
      std::__cxx11::string::~string(local_d78);
      std::allocator<char>::~allocator(&local_d79);
      local_dc0 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_12._M_str = (char *)in_stack_ffffffffffffe858;
      src_12._M_len = (size_t)in_stack_ffffffffffffe850;
      to_12._M_str = in_stack_ffffffffffffe848;
      to_12._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_12,in_stack_ffffffffffffe838,to_12);
      std::__cxx11::string::operator=(local_7f8,local_db0);
      std::__cxx11::string::~string(local_db0);
      std::__cxx11::string::~string(local_de0);
      std::allocator<char>::~allocator(&local_de1);
      local_e28 = std::__cxx11::string::operator_cast_to_basic_string_view(local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
      src_13._M_str = (char *)in_stack_ffffffffffffe858;
      src_13._M_len = (size_t)in_stack_ffffffffffffe850;
      to_13._M_str = in_stack_ffffffffffffe848;
      to_13._M_len = in_stack_ffffffffffffe840;
      util::str_replace(src_13,in_stack_ffffffffffffe838,to_13);
      std::__cxx11::string::operator=(local_7f8,local_e18);
      std::__cxx11::string::~string(local_e18);
      std::__cxx11::string::~string(local_e48);
      std::allocator<char>::~allocator(&local_e49);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(flag_type)((ulong)in_stack_ffffffffffffe790 >> 0x20));
      std::
      regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                (in_stack_ffffffffffffe7b8,in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7a8,
                 in_stack_ffffffffffffe7a4);
      std::__cxx11::string::operator=(local_7f8,local_e80);
      std::__cxx11::string::~string(local_e80);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_ffffffffffffe760);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(flag_type)((ulong)in_stack_ffffffffffffe790 >> 0x20));
      std::
      regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                (in_stack_ffffffffffffe7b8,in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7a8,
                 in_stack_ffffffffffffe7a4);
      std::__cxx11::string::operator=(local_7f8,local_ec0);
      std::__cxx11::string::~string(local_ec0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_ffffffffffffe760);
      for (local_ee8 = 0; local_ee8 < 0xe; local_ee8 = local_ee8 + 1) {
        local_ef0 = (char *)strlen(latex_to_nivalis::SPECIAL_COMMANDS[local_ee8]);
        pcVar5 = (char *)std::__cxx11::string::size();
        if (local_ef0 < pcVar5) {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
          if (*pcVar5 == '\\') {
            iVar3 = std::__cxx11::string::compare((ulong)local_7f8,1,local_ef0);
            if (iVar3 == 0) {
              puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_7f8);
              *puVar6 = 0x25;
            }
          }
        }
      }
      std::__cxx11::string::operator[]((ulong)local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe780,in_stack_ffffffffffffe778,
                 (char)((ulong)in_stack_ffffffffffffe770 >> 0x38),in_stack_ffffffffffffe768);
      std::allocator<char>::~allocator(&local_f11);
      std::__cxx11::string::size();
      std::__cxx11::string::reserve((ulong)local_f10);
      local_f20 = 1;
      while( true ) {
        uVar4 = local_f20;
        uVar7 = std::__cxx11::string::size();
        __c = (char)((ulong)in_stack_ffffffffffffe770 >> 0x38);
        if (uVar7 <= uVar4) break;
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
        if (*pcVar5 == '{') {
LAB_0027d4a5:
          std::__cxx11::string::operator[]((ulong)local_7f8);
          std::__cxx11::string::push_back((char)local_f10);
        }
        else {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
          if (*pcVar5 != '_') {
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
            if (*pcVar5 != '^') goto LAB_0027d4a5;
          }
          std::__cxx11::string::push_back((char)local_f10);
          std::__cxx11::string::operator[]((ulong)local_7f8);
          std::__cxx11::string::push_back((char)local_f10);
          std::__cxx11::string::push_back((char)local_f10);
        }
        local_f20 = local_f20 + 1;
      }
      std::__cxx11::string::operator=(local_7f8,local_f10);
      std::__cxx11::string::~string(local_f10);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(flag_type)((ulong)in_stack_ffffffffffffe790 >> 0x20));
      std::
      regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                (in_stack_ffffffffffffe7b8,in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7a8,
                 in_stack_ffffffffffffe7a4);
      std::__cxx11::string::operator=(local_7f8,local_f40);
      std::__cxx11::string::~string(local_f40);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_ffffffffffffe760);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,(flag_type)((ulong)in_stack_ffffffffffffe790 >> 0x20));
      std::
      regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                (in_stack_ffffffffffffe7b8,in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7a8,
                 in_stack_ffffffffffffe7a4);
      std::__cxx11::string::operator=(local_7f8,local_f80);
      std::__cxx11::string::~string(local_f80);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_ffffffffffffe760);
      anon_unknown_1::ParenRule::operator()(in_stack_ffffffffffffe858,in_stack_ffffffffffffe850);
      anon_unknown_1::ParenRule::operator()(in_stack_ffffffffffffe858,in_stack_ffffffffffffe850);
      anon_unknown_1::ParenRule::operator()(in_stack_ffffffffffffe858,in_stack_ffffffffffffe850);
      anon_unknown_1::ParenRule::operator()(in_stack_ffffffffffffe858,in_stack_ffffffffffffe850);
      anon_unknown_1::ParenRule::operator()(in_stack_ffffffffffffe858,in_stack_ffffffffffffe850);
      anon_unknown_1::ParenRule::operator()(in_stack_ffffffffffffe858,in_stack_ffffffffffffe850);
      anon_unknown_1::ParenRule::operator()(in_stack_ffffffffffffe858,in_stack_ffffffffffffe850);
      anon_unknown_1::ParenRule::operator()(in_stack_ffffffffffffe858,in_stack_ffffffffffffe850);
      std::__cxx11::string::operator=(local_7f8,local_fc0);
      std::__cxx11::string::~string(local_fc0);
      std::__cxx11::string::~string(local_fe0);
      std::__cxx11::string::~string(local_1000);
      std::__cxx11::string::~string(local_1020);
      std::__cxx11::string::~string(local_1040);
      std::__cxx11::string::~string(local_1060);
      std::__cxx11::string::~string(local_1080);
      std::__cxx11::string::~string(local_10a0);
      std::__cxx11::string::operator[]((ulong)local_7f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe780,in_stack_ffffffffffffe778,__c,in_stack_ffffffffffffe768);
      std::allocator<char>::~allocator(&local_10c1);
      std::__cxx11::string::size();
      std::__cxx11::string::reserve((ulong)&local_10c0);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
      local_10c2 = *pcVar5;
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)0x27d8eb);
      local_10f8 = 0;
      local_1108 = 1;
      uVar4 = std::__cxx11::string::size();
      local_1129 = 0;
      local_1741 = false;
      if (5 < uVar4) {
        std::__cxx11::string::substr((ulong)local_1128,(ulong)local_7f8);
        local_1129 = 1;
        local_1741 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_ffffffffffffe760,
                                     (char *)CONCAT17(in_stack_ffffffffffffe75f,
                                                      CONCAT16(in_stack_ffffffffffffe75e,
                                                               CONCAT15(in_stack_ffffffffffffe75d,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffe75c,
                                                  in_stack_ffffffffffffe758)))));
      }
      if ((local_1129 & 1) != 0) {
        std::__cxx11::string::~string(local_1128);
      }
      if (local_1741 == false) {
        uVar4 = std::__cxx11::string::size();
        if (1 < uVar4) {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
          if (*pcVar5 == '%') {
            local_1108 = std::__cxx11::string::find((char)local_7f8,0x20);
            std::__cxx11::string::substr((ulong)local_1170,(ulong)local_7f8);
            std::__cxx11::string::operator=((string *)&local_10c0,local_1170);
            std::__cxx11::string::~string(local_1170);
            if (local_1108 == 0xffffffffffffffff) {
              local_1108 = std::__cxx11::string::size();
            }
          }
        }
      }
      else {
        local_1108 = std::__cxx11::string::find((char)local_7f8,0x40);
        std::__cxx11::string::substr((ulong)local_1150,(ulong)local_7f8);
        std::__cxx11::string::operator=((string *)&local_10c0,local_1150);
        std::__cxx11::string::~string(local_1150);
        if (local_1108 == 0xffffffffffffffff) {
          local_1108 = std::__cxx11::string::size();
        }
      }
      while( true ) {
        uVar4 = local_1108;
        uVar7 = std::__cxx11::string::size();
        if (uVar7 <= uVar4) break;
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
        iVar3 = isspace((int)*pcVar5);
        if (iVar3 == 0) {
LAB_0027dded:
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
          if (*pcVar5 == '{') {
            std::vector<bool,_std::allocator<bool>_>::push_back
                      (in_stack_ffffffffffffe7c0,SUB81((ulong)in_stack_ffffffffffffe7b8 >> 0x38,0));
            rVar11 = std::vector<bool,_std::allocator<bool>_>::back
                               ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffe790);
            local_1180 = rVar11;
            bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_1180);
            if (bVar2) {
              local_10f8 = local_10f8 + 1;
            }
          }
          else {
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
            if (*pcVar5 == '}') {
              sVar8 = std::vector<bool,_std::allocator<bool>_>::size
                                ((vector<bool,_std::allocator<bool>_> *)
                                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
              if (sVar8 != 0) {
                rVar11 = std::vector<bool,_std::allocator<bool>_>::back
                                   ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffe790
                                   );
                local_1190 = rVar11;
                bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_1190);
                if (bVar2) {
                  local_10f8 = local_10f8 + -1;
                }
                std::vector<bool,_std::allocator<bool>_>::pop_back
                          ((vector<bool,_std::allocator<bool>_> *)0x27df62);
              }
            }
          }
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
          if (*pcVar5 == '\\') {
            lVar9 = local_1108 + 1;
            lVar10 = std::__cxx11::string::size();
            if (lVar9 != lVar10) {
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
              if (*pcVar5 != '}') {
                pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
                if (*pcVar5 != ' ') goto LAB_0027e032;
              }
              goto LAB_0027e064;
            }
LAB_0027e032:
            bVar2 = latex_to_nivalis::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe760,
                               in_stack_ffffffffffffe75f,(bool)in_stack_ffffffffffffe75e,
                               (bool)in_stack_ffffffffffffe75d);
            if (bVar2) goto LAB_0027e064;
LAB_0027e0db:
            std::__cxx11::string::push_back((char)&local_10c0);
          }
          else {
LAB_0027e064:
            bVar2 = util::is_close_bracket(local_10c2);
            if (bVar2) {
              std::__cxx11::string::operator[]((ulong)local_7f8);
              bVar2 = latex_to_nivalis::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe760,
                                 in_stack_ffffffffffffe75f,(bool)in_stack_ffffffffffffe75e,
                                 (bool)in_stack_ffffffffffffe75d);
              if (!bVar2) goto LAB_0027e0db;
            }
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
            bVar2 = util::is_open_bracket(*pcVar5);
            if (bVar2) {
              bVar2 = latex_to_nivalis::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffe760,
                                 in_stack_ffffffffffffe75f,(bool)in_stack_ffffffffffffe75e,
                                 (bool)in_stack_ffffffffffffe75d);
              if (!bVar2) {
                iVar3 = isalpha((int)local_10c2);
                if (iVar3 != 0) {
                  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
                  if (*pcVar5 == '(') goto LAB_0027e2e8;
                }
                std::__cxx11::string::push_back((char)&local_10c0);
                goto LAB_0027e2e8;
              }
            }
            if (local_10f8 == 0) {
              std::__cxx11::string::operator[]((ulong)local_7f8);
              bVar2 = util::is_identifier('\0');
              if (((bVar2) && (local_10c2 != '$')) && (local_10c2 != '@')) {
                bVar2 = util::is_identifier('\0');
                if (bVar2) {
                  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
                  bVar2 = util::is_numeric(*pcVar5);
                  bVar1 = util::is_numeric(local_10c2);
                  if (bVar2 != bVar1) {
                    std::__cxx11::string::push_back((char)&local_10c0);
                  }
                }
              }
            }
          }
LAB_0027e2e8:
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
          local_10c2 = *pcVar5;
          in_stack_ffffffffffffe7c0 =
               (vector<bool,_std::allocator<bool>_> *)
               std::__cxx11::string::operator[]((ulong)local_7f8);
          if (*(char *)&(in_stack_ffffffffffffe7c0->super__Bvector_base<std::allocator<bool>_>).
                        _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
              '\v') {
            in_stack_ffffffffffffe7b8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::operator[]((ulong)local_7f8);
            std::__cxx11::string::push_back((char)&local_10c0);
          }
        }
        else {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
          if (*pcVar5 == '\v') goto LAB_0027dded;
          std::__cxx11::string::operator[]((ulong)local_7f8);
          std::__cxx11::string::push_back((char)&local_10c0);
        }
        local_1108 = local_1108 + 1;
      }
      __e = &local_10c0;
      std::__cxx11::string::operator=(local_7f8,(string *)__e);
      __f = (flag_type)((ulong)in_stack_ffffffffffffe790 >> 0x20);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x27e3b8);
      std::__cxx11::string::~string((string *)__e);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798,__f);
      std::
      regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                (in_stack_ffffffffffffe7b8,__e,in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a4);
      psVar12 = local_11b0;
      std::__cxx11::string::operator=(local_7f8,psVar12);
      std::__cxx11::string::~string(psVar12);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_ffffffffffffe760);
      psVar12 = local_11f0;
      std::__cxx11::string::string(psVar12);
      std::__cxx11::string::size();
      std::__cxx11::string::reserve((ulong)psVar12);
      local_11f8 = 0;
      while( true ) {
        uVar4 = local_11f8;
        uVar7 = std::__cxx11::string::size();
        if (uVar7 <= uVar4) break;
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
        if (*pcVar5 == '{') {
          if (local_11f8 != 0) {
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
            if (*pcVar5 == '\\') goto LAB_0027e58a;
          }
          std::__cxx11::string::push_back((char)local_11f0);
        }
        else {
LAB_0027e58a:
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
          if (*pcVar5 == '}') {
            if (local_11f8 != 0) {
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
              if (*pcVar5 == '\\') goto LAB_0027e600;
            }
            std::__cxx11::string::push_back((char)local_11f0);
          }
          else {
LAB_0027e600:
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_7f8);
            if (*pcVar5 != '\\') {
              std::__cxx11::string::operator[]((ulong)local_7f8);
              std::__cxx11::string::push_back((char)local_11f0);
            }
          }
        }
        local_11f8 = local_11f8 + 1;
      }
      std::__cxx11::string::operator=(local_7f8,local_11f0);
      std::__cxx11::string::~string(local_11f0);
      std::__cxx11::string::string((string *)in_RDI,local_7f8);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
               in_stack_ffffffffffffe798,(allocator<char> *)in_stack_ffffffffffffe790);
    std::allocator<char>::~allocator(&local_7f9);
  }
  local_800 = 1;
  std::__cxx11::string::~string(local_7f8);
  return in_RDI;
}

Assistant:

std::string latex_to_nivalis(const std::string& expr_in) {
#define NO_IMPLICIT_MULT "\v" // Special character used to indicate we should not add * here
    thread_local ParenRule
        l2n_nthroot { "\\sqrt", {'[', '{'},  // Input spec: prefix, paren types (end paren inferred)
            {"(", 1, ")^(1/(", 0, "))"} },   // Output spec: output arg order
        l2n_sqrt { "\\sqrt", {'{'},
            {"sqrt(", 0, ")"} },
        l2n_frac { "\\frac", {'{', '{'},
            {"((", 0, ")/(", 1, "))"} },
        l2n_logbase { "\\log_", {'{', '('},
            {"log(", 1, ", ", 0, ")"} },
        l2n_sum { "\\sum_", {'{', '^'},
            {"sum(", 0, ", ", 1, ")\v"} },
        l2n_prod { "\\prod_", {'{', '^'},
            {"prod(", 0, ", ", 1, ")\v"} },
        l2n_int { "\\int_", {'{', '^'},
            {"int(", 0, ", ", 1, ")\v"} },
        l2n_choose { "\\binom", {'{', '{'},
            {"choose(", 0, ", ", 1, ")"} };

    std::string expr = expr_in;
    util::trim(expr);
    if (expr.empty()) return "";
    if (expr.size() >= 6 && expr.substr(0, 6) == "\\text{" &&
           expr.back() == '}') {
        // Comment
        return "#" + expr.substr(6, expr.size() - 7);
    }

    expr = util::str_replace(expr, "\\left|", "abs(");
    expr = util::str_replace(expr, "\\right|", ")");
    expr = util::str_replace(expr, "\\lfloor", "floor(");
    expr = util::str_replace(expr, "\\rfloor", ")");
    expr = util::str_replace(expr, "\\lceil|", "ceil(");
    expr = util::str_replace(expr, "\\rceil|", ")");
    expr = util::str_replace(expr, "\\left", "");
    expr = util::str_replace(expr, "\\right", "");
    expr = util::str_replace(expr, "\\cdot", "*");
    expr = util::str_replace(expr, "\\le", "<=");
    expr = util::str_replace(expr, "\\ge", ">=");
    expr = util::str_replace(expr, "\\ne", "!=");
    expr = util::str_replace(expr, "\\operatorname{and}", "&");
    expr = util::str_replace(expr, "\\operatorname{or}", "|");
    expr = util::str_replace(expr, "\\operatorname{at}", "@");

    static const char*  SPECIAL_COMMANDS[] = {
        "poly", "fpoly", "Fpoly",
        "rect", "frect", "Frect",
        "circ", "fcirc", "Fcirc",
        "ellipse", "fellipse", "Fellipse",
        "text",
        "mandelbrot"
    };

    // Remove operatorname
    expr = std::regex_replace(expr,
            std::regex(R"(\\operatorname\{(.+?)\})"), "\\$1 ");

    // Remove text{}
    expr = std::regex_replace(expr,
            std::regex(R"(\\text\{(.+?)\})"), "$1");

    // Remap drawing commands
    for (size_t i = 0; i < sizeof(SPECIAL_COMMANDS) / sizeof(SPECIAL_COMMANDS[0]); ++i) {
        const size_t len = strlen(SPECIAL_COMMANDS[i]);
        if (expr.size() > len &&
                expr[0] == '\\' && expr.compare(1, len, SPECIAL_COMMANDS[i]) == 0) {
            expr[0] = '%';
        }
    }

    {
        std::string tmp(1, expr[0]);
        // Add braces so that x^22 -> x^{2}2,
        //                  log_22 -> log_{2}2
        tmp.reserve(expr.size());
        for (size_t i = 1; i < expr.size(); ++i) {
            if (expr[i] != '{' && (expr[i-1] == '_' || expr[i-1] == '^')) {
                tmp.push_back('{');
                tmp.push_back(expr[i]);
                tmp.push_back('}');
            } else {
                tmp.push_back(expr[i]);
            }
        }
        expr = std::move(tmp);
    }

    // Map (sin/cos/tan)^{-1} -> arg(..)
    expr = std::regex_replace(expr,
            std::regex(R"(\\(sin|cos|tan)( *?)\^\{-1\})"), "\\arc$1 ");

    // Diff
    expr = std::regex_replace(expr,
            std::regex(R"(\\frac\{d\}\{d([a-zA-Z][a-zA-Z_0-9\{\}]*?)\})"), "diff($1)" NO_IMPLICIT_MULT);

    // Apply parenthesis-based rules
    expr = l2n_choose(l2n_frac(l2n_int(
                    l2n_prod(l2n_sum(l2n_sqrt(
                                l2n_nthroot(l2n_logbase(expr))
                    )))
            )));

    // Implicit multiply
    {
        std::string tmp(1, expr[0]); tmp.reserve(expr.size());
        char last_nonspace = expr[0];
        std::vector<bool> brace_subs;
        size_t sub_level = 0; // subscript level

        auto is_opchar = [](char c, bool allow_open_brkt, bool allow_close_brkt) {
            return util::is_operator(c) ||
                util::is_control(c) ||
                (!allow_open_brkt && util::is_open_bracket(c)) ||
                (!allow_close_brkt && util::is_close_bracket(c)) ||
                c == '_' ||
                c == NO_IMPLICIT_MULT[0];
        };
        size_t i = 1;
        if (expr.size() > 5 && expr.substr(0, 5) == "%text") {
            i = expr.find('@');
            tmp = expr.substr(0, i);
            if (i == std::string::npos) i = expr.size();
        } else if (expr.size() > 1 && expr[0] == '%') {
            i = expr.find(' ');
            tmp = expr.substr(0, i);
            if (i == std::string::npos) i = expr.size();
        }
        for (; i < expr.size(); ++i) {
            if (std::isspace(expr[i]) && expr[i] != NO_IMPLICIT_MULT[0]) {
                tmp.push_back(expr[i]);
                continue;
            }
            if (expr[i] == '{') {
                brace_subs.push_back(last_nonspace == '_');
                if (brace_subs.back()) sub_level++;
            } else if (expr[i] == '}') {
                if (brace_subs.size()) {
                    if (brace_subs.back()) sub_level--;
                    brace_subs.pop_back();
                }
            }
            if ((expr[i] == '\\' &&
                    (i + 1 == expr.size() ||
                     (expr[i+1] != '}' && expr[i+1] != ' ')) && // not '\}' or '\ '
                    !is_opchar(last_nonspace, false, true)) ||
                (util::is_close_bracket(last_nonspace) &&
                    !is_opchar(expr[i], true, false))) {
                tmp.push_back('*');
            } else if (util::is_open_bracket(expr[i]) &&
                    !is_opchar(last_nonspace, false, true)){
                if (!std::isalpha(last_nonspace) || expr[i] != '(')  // not beginning of call
                    tmp.push_back('*');
            } else if (sub_level == 0 &&
                       util::is_identifier(expr[i]) && last_nonspace != '$' && last_nonspace != '@' &&
                       util::is_identifier(last_nonspace) &&
                       util::is_numeric(expr[i]) !=
                       util::is_numeric(last_nonspace)) {
                tmp.push_back('*');
            }
            last_nonspace = expr[i];
            if (expr[i] != NO_IMPLICIT_MULT[0])
                tmp.push_back(expr[i]);
        }
        expr = std::move(tmp);
    }

    // Subscript
    expr = std::regex_replace(expr,
            std::regex(R"(_\{(.+?)\}\*?)"), "$1");

    // Remove any remaining backslashes, convert {}
    {
        std::string tmp; tmp.reserve(expr.size());
        for (size_t i = 0; i < expr.size(); ++i) {
            if (expr[i] == '{' && (i == 0 || expr[i-1] != '\\')) {
                tmp.push_back('(');
            } else if (expr[i] == '}' && (i == 0 || expr[i-1] != '\\')) {
                tmp.push_back(')');
            } else if (expr[i] != '\\') {
                tmp.push_back(expr[i]);
            }
        }
        expr = std::move(tmp);
    }
    return expr;
}